

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_helpers.hpp
# Opt level: O2

void print_py_error(void)

{
  _object *x;
  result_type pbVar1;
  logger *this;
  object err;
  object sys;
  string err_text;
  logger safe_cout;
  object_base local_c0;
  object_base local_b8;
  object_base local_b0;
  object_base local_a8;
  char *local_a0;
  undefined1 local_98 [16];
  rvalue_from_python_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  logger local_30;
  
  boost::recursive_mutex::recursive_mutex(&local_30.cout_guard);
  PyErr_Print();
  x = (_object *)PyImport_ImportModule("sys");
  local_98._0_8_ = boost::python::expect_non_null<_object>(x);
  boost::python::api::object::object((object *)&local_b0,(handle *)local_98);
  boost::python::handle<_object>::~handle((handle<_object> *)local_98);
  (local_b0.m_ptr)->ob_refcnt = (local_b0.m_ptr)->ob_refcnt + 1;
  local_98._0_8_ = local_b0.m_ptr;
  local_98._8_8_ = "stderr";
  boost::python::api::proxy::operator_cast_to_object((proxy *)&local_b8);
  boost::python::api::object_base::~object_base((object_base *)local_98);
  (local_b8.m_ptr)->ob_refcnt = (local_b8.m_ptr)->ob_refcnt + 1;
  local_a8.m_ptr = local_b8.m_ptr;
  local_a0 = "getvalue";
  boost::python::api::
  object_operators<boost::python::api::proxy<boost::python::api::attribute_policies>_>::operator()
            ((object_operators<boost::python::api::proxy<boost::python::api::attribute_policies>_> *
             )&local_c0);
  boost::python::converter::
  extract_rvalue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  extract_rvalue((extract_rvalue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_98,local_c0.m_ptr);
  pbVar1 = boost::python::converter::
           extract_rvalue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator()((extract_rvalue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_98);
  std::__cxx11::string::string((string *)&local_50,(string *)pbVar1);
  boost::python::converter::
  rvalue_from_python_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~rvalue_from_python_data(&local_88);
  boost::python::api::object_base::~object_base(&local_c0);
  boost::python::api::object_base::~object_base(&local_a8);
  this = logger::operator<<(&local_30,&local_50);
  logger::operator<<(this,(char (*) [2])0x110034);
  std::__cxx11::string::~string((string *)&local_50);
  boost::python::api::object_base::~object_base(&local_b8);
  boost::python::api::object_base::~object_base(&local_b0);
  PyErr_Clear();
  boost::recursive_mutex::~recursive_mutex(&local_30.cout_guard);
  return;
}

Assistant:

void print_py_error() {
    logger safe_cout;
	try {
		PyErr_Print();
		bp::object sys(bp::handle<>(PyImport_ImportModule("sys")));
		bp::object err = sys.attr("stderr");
		std::string err_text = bp::extract<std::string>(err.attr("getvalue")());
		safe_cout << err_text << "\n";
	} catch (...) {
		safe_cout << "Failed to parse python error\n";
	}
	PyErr_Clear();
}